

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O2

int LZ4_decompress_safe_withPrefix64k(char *source,char *dest,int compressedSize,int maxOutputSize)

{
  char *pcVar1;
  byte *pbVar2;
  char *pcVar3;
  byte bVar4;
  char cVar5;
  uint uVar6;
  undefined8 uVar7;
  ushort uVar8;
  ushort uVar9;
  ushort *puVar10;
  ushort *__src;
  char *pcVar11;
  ulong uVar12;
  char *pcVar13;
  long lVar14;
  size_t __n;
  long lVar15;
  char *pcVar16;
  int iVar17;
  BYTE *d_2;
  ulong uVar18;
  char *pcVar19;
  BYTE *e;
  ushort *puVar20;
  long lVar21;
  BYTE *oCopyLimit;
  int local_38;
  
  iVar17 = -1;
  if (-1 < maxOutputSize && source != (char *)0x0) {
    if (maxOutputSize == 0) {
      if (compressedSize == 1) {
        iVar17 = -(uint)(*source != '\0');
      }
    }
    else if (compressedSize != 0) {
      pbVar2 = (byte *)(source + compressedSize);
      uVar12 = (ulong)(uint)maxOutputSize;
      pcVar1 = dest + (uVar12 - 7);
      lVar21 = 0;
      puVar20 = (ushort *)source;
      do {
        while( true ) {
          pcVar13 = dest + lVar21;
          __src = (ushort *)((long)puVar20 + 1);
          bVar4 = (byte)*puVar20;
          __n = (size_t)(uint)(bVar4 >> 4);
          if (bVar4 >> 4 == 0xf) break;
          if ((source + (long)compressedSize + -0x10 <= __src) || (dest + (uVar12 - 0x20) < pcVar13)
             ) goto LAB_0028bf6d;
          uVar7 = *(undefined8 *)((long)puVar20 + 9);
          *(undefined8 *)pcVar13 = *(undefined8 *)__src;
          *(undefined8 *)(pcVar13 + 8) = uVar7;
          lVar21 = lVar21 + __n;
          uVar18 = (ulong)(bVar4 & 0xf);
          puVar20 = (ushort *)((long)__src + __n);
          __src = puVar20 + 1;
          uVar8 = *puVar20;
          lVar14 = lVar21 - (ulong)uVar8;
          if (uVar8 < 8 || uVar18 == 0xf) goto LAB_0028c029;
          *(undefined8 *)(dest + lVar21) = *(undefined8 *)(dest + lVar14);
          *(undefined8 *)(dest + lVar21 + 8) = *(undefined8 *)(dest + lVar14 + 8);
          *(undefined2 *)(dest + lVar21 + 0x10) = *(undefined2 *)(dest + lVar14 + 0x10);
          lVar21 = lVar21 + uVar18 + 4;
          puVar20 = __src;
        }
        if (pbVar2 + -0xf <= __src) goto LAB_0028c1a5;
        puVar20 = puVar20 + 1;
        lVar14 = 0;
        puVar10 = __src;
        do {
          __src = (ushort *)((long)puVar10 + 1);
          if (pbVar2 + -0xf < __src) goto LAB_0028c1a5;
          uVar8 = *puVar10;
          lVar14 = lVar14 + (ulong)(byte)uVar8;
          puVar20 = (ushort *)((long)puVar20 + 1);
          puVar10 = __src;
        } while ((ulong)(byte)uVar8 == 0xff);
        if (((lVar14 == -1) || (__n = lVar14 + 0xf, CARRY8((ulong)pcVar13,__n))) ||
           ((ulong)-(long)puVar20 < __n)) goto LAB_0028c1a5;
LAB_0028bf6d:
        lVar21 = lVar21 + __n;
        if ((dest + (uVar12 - 0xc) < dest + lVar21) ||
           (puVar20 = (ushort *)((long)__src + __n), pbVar2 + -8 < puVar20)) {
          if (((byte *)((long)__src + __n) == pbVar2) && (lVar21 <= (long)uVar12)) {
            memmove(pcVar13,__src,__n);
            return (int)lVar21;
          }
LAB_0028c1a5:
          local_38 = (int)source;
          return ~(uint)__src + local_38;
        }
        do {
          *(undefined8 *)pcVar13 = *(undefined8 *)__src;
          pcVar13 = pcVar13 + 8;
          __src = __src + 4;
        } while (pcVar13 < dest + lVar21);
        uVar8 = *puVar20;
        __src = puVar20 + 1;
        lVar14 = lVar21 - (ulong)uVar8;
        uVar18 = (ulong)(bVar4 & 0xf);
LAB_0028c029:
        pcVar13 = dest + lVar21;
        if ((int)uVar18 == 0xf) {
          lVar15 = 0;
          puVar20 = __src;
          do {
            __src = (ushort *)((long)puVar20 + 1);
            if (pbVar2 + -4 < __src) goto LAB_0028c1a5;
            uVar9 = *puVar20;
            lVar15 = lVar15 + (ulong)(byte)uVar9;
            puVar20 = __src;
          } while ((ulong)(byte)uVar9 == 0xff);
          uVar18 = lVar15 + 0xf;
          if ((lVar15 == -1) || (CARRY8((ulong)pcVar13,uVar18))) goto LAB_0028c1a5;
        }
        if (lVar14 < -0x10000) goto LAB_0028c1a5;
        pcVar16 = dest + lVar14;
        if (uVar8 < 8) {
          pcVar13[0] = '\0';
          pcVar13[1] = '\0';
          pcVar13[2] = '\0';
          pcVar13[3] = '\0';
          *pcVar13 = *pcVar16;
          pcVar13[1] = pcVar16[1];
          pcVar13[2] = pcVar16[2];
          pcVar13[3] = pcVar16[3];
          uVar6 = inc32table[uVar8];
          *(undefined4 *)(pcVar13 + 4) = *(undefined4 *)(pcVar16 + uVar6);
          pcVar16 = pcVar16 + ((ulong)uVar6 - (long)dec64table[uVar8]);
        }
        else {
          *(undefined8 *)pcVar13 = *(undefined8 *)pcVar16;
          pcVar16 = pcVar16 + 8;
        }
        lVar21 = lVar21 + uVar18 + 4;
        pcVar3 = dest + lVar21;
        pcVar11 = pcVar13 + 8;
        puVar20 = __src;
        if (dest + (uVar12 - 0xc) < pcVar3) {
          if (dest + (uVar12 - 5) < pcVar3) goto LAB_0028c1a5;
          pcVar13 = pcVar16;
          pcVar19 = pcVar11;
          if (pcVar11 < pcVar1) {
            do {
              *(undefined8 *)pcVar19 = *(undefined8 *)pcVar13;
              pcVar19 = pcVar19 + 8;
              pcVar13 = pcVar13 + 8;
            } while (pcVar19 < pcVar1);
            pcVar16 = pcVar16 + ((long)pcVar1 - (long)pcVar11);
            pcVar11 = pcVar1;
          }
          for (; pcVar11 < pcVar3; pcVar11 = pcVar11 + 1) {
            cVar5 = *pcVar16;
            pcVar16 = pcVar16 + 1;
            *pcVar11 = cVar5;
          }
        }
        else {
          *(undefined8 *)pcVar11 = *(undefined8 *)pcVar16;
          if (0x10 < uVar18 + 4) {
            pcVar13 = pcVar13 + 0x10;
            do {
              pcVar16 = pcVar16 + 8;
              *(undefined8 *)pcVar13 = *(undefined8 *)pcVar16;
              pcVar13 = pcVar13 + 8;
            } while (pcVar13 < pcVar3);
          }
        }
      } while( true );
    }
  }
  return iVar17;
}

Assistant:

LZ4_FORCE_O2 /* Exported, an obsolete API function. */
int LZ4_decompress_safe_withPrefix64k(const char* source, char* dest, int compressedSize, int maxOutputSize)
{
    return LZ4_decompress_generic(source, dest, compressedSize, maxOutputSize,
                                  decode_full_block, withPrefix64k,
                                  (BYTE*)dest - 64 KB, NULL, 0);
}